

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::HttpHeaders::add(HttpHeaders *this,String *name,String *value)

{
  String *pSVar1;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  String *local_20;
  String *value_local;
  String *name_local;
  HttpHeaders *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (String *)this;
  StringPtr::StringPtr((StringPtr *)&local_30,name);
  StringPtr::StringPtr((StringPtr *)&local_40,local_20);
  add(this,(StringPtr)local_30,(StringPtr)local_40);
  pSVar1 = mv<kj::String>(value_local);
  takeOwnership(this,pSVar1);
  pSVar1 = mv<kj::String>(local_20);
  takeOwnership(this,pSVar1);
  return;
}

Assistant:

void HttpHeaders::add(kj::String&& name, kj::String&& value) {
  add(kj::StringPtr(name), kj::StringPtr(value));
  takeOwnership(kj::mv(name));
  takeOwnership(kj::mv(value));
}